

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
emplaceValue<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (Node<unsigned_long_long,QSslServerPrivate::SocketData> *this,Connection *args,
          Connection *args_1,shared_ptr<QTimer> *args_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  Connection CStack_68;
  Connection local_60;
  Connection local_58;
  Connection CStack_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::Connection::Connection(&local_60,args);
  QMetaObject::Connection::Connection(&CStack_68,args_1);
  QMetaObject::Connection::Connection(&local_58,&local_60);
  QMetaObject::Connection::Connection(&CStack_50,&CStack_68);
  local_48 = 0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (args_2->super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pvVar3 = *(void **)(this + 8);
  pvVar4 = *(void **)(this + 0x10);
  *(void **)(this + 8) = local_58.d_ptr;
  *(void **)(this + 0x10) = CStack_50.d_ptr;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20);
  *(element_type **)(this + 0x18) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x20) = p_Var2;
  local_58.d_ptr = pvVar3;
  CStack_50.d_ptr = pvVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  QMetaObject::Connection::~Connection(&CStack_50);
  QMetaObject::Connection::~Connection(&local_58);
  QMetaObject::Connection::~Connection(&CStack_68);
  QMetaObject::Connection::~Connection(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }